

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

void __thiscall iDynTree::KinDynComputations::resizeInternalDataStructures(KinDynComputations *this)

{
  long lVar1;
  SpatialVector<iDynTree::SpatialMotionVector> *this_00;
  long in_RDI;
  LinkIndex lnkIdx;
  undefined8 local_10;
  
  iDynTree::FreeFloatingPos::resize((Model *)(*(long *)(in_RDI + 8) + 0x1b0));
  iDynTree::FreeFloatingVel::resize((Model *)(*(long *)(in_RDI + 8) + 0x238));
  iDynTree::LinkPositions::resize((Model *)(*(long *)(in_RDI + 8) + 0x2f8));
  iDynTree::LinkVelArray::resize((Model *)(*(long *)(in_RDI + 8) + 0x310));
  iDynTree::LinkInertias::resize((Model *)(*(long *)(in_RDI + 8) + 0x330));
  iDynTree::FreeFloatingMassMatrix::resize((Model *)(*(long *)(in_RDI + 8) + 0x3a8));
  iDynTree::MatrixDynSize::zero();
  this_00 = (SpatialVector<iDynTree::SpatialMotionVector> *)(*(long *)(in_RDI + 8) + 0x408);
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize((ulong)this_00,6);
  iDynTree::MatrixDynSize::zero();
  SpatialVector<iDynTree::SpatialMotionVector>::zero(this_00);
  iDynTree::LinkAccArray::resize((Model *)(*(long *)(in_RDI + 8) + 0x468));
  SpatialVector<iDynTree::SpatialMotionVector>::zero(this_00);
  iDynTree::FreeFloatingAcc::resize((Model *)(*(long *)(in_RDI + 8) + 0x4b0));
  iDynTree::LinkAccArray::resize((Model *)(*(long *)(in_RDI + 8) + 0x508));
  SpatialVector<iDynTree::SpatialMotionVector>::zero(this_00);
  iDynTree::FreeFloatingAcc::resize((Model *)(*(long *)(in_RDI + 8) + 0x550));
  iDynTree::LinkWrenches::resize((Model *)(*(long *)(in_RDI + 8) + 0x5c0));
  iDynTree::LinkWrenches::resize((Model *)(*(long *)(in_RDI + 8) + 0x5d8));
  iDynTree::LinkAccArray::resize((Model *)(*(long *)(in_RDI + 8) + 0x5a8));
  iDynTree::FreeFloatingVel::resize((Model *)(*(long *)(in_RDI + 8) + 0x5f0));
  iDynTree::FreeFloatingVel::baseVel();
  SpatialVector<iDynTree::SpatialMotionVector>::zero(this_00);
  iDynTree::FreeFloatingVel::jointVel();
  iDynTree::VectorDynSize::zero();
  iDynTree::LinkVelArray::resize((Model *)(*(long *)(in_RDI + 8) + 0x648));
  iDynTree::LinkAccArray::resize((Model *)(*(long *)(in_RDI + 8) + 0x660));
  iDynTree::LinkTraversalsCache::resize((Model *)(*(long *)(in_RDI + 8) + 0x198));
  iDynTree::FreeFloatingGeneralizedTorques::resize((Model *)(*(long *)(in_RDI + 8) + 0x348));
  local_10 = 0;
  while( true ) {
    lVar1 = iDynTree::Model::getNrOfLinks();
    if (lVar1 <= local_10) break;
    iDynTree::LinkVelArray::operator()((LinkVelArray *)(*(long *)(in_RDI + 8) + 0x648),local_10);
    SpatialVector<iDynTree::SpatialMotionVector>::zero(this_00);
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void KinDynComputations::resizeInternalDataStructures()
{
    assert(this->pimpl->m_isModelValid);

    this->pimpl->m_pos.resize(this->pimpl->m_robot_model);
    this->pimpl->m_vel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkPos.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkVel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkCRBIs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_rawMassMatrix.resize(this->pimpl->m_robot_model);
    this->pimpl->m_rawMassMatrix.zero();
    this->pimpl->m_jacBuffer.resize(6,6+this->pimpl->m_robot_model.getNrOfDOFs());
    this->pimpl->m_jacBuffer.zero();
    this->pimpl->m_baseBiasAcc.zero();
    this->pimpl->m_linkBiasAcc.resize(this->pimpl->m_robot_model);
    this->pimpl->m_baseAcc.zero();
    this->pimpl->m_generalizedAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_linkAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynBaseAcc.zero();
    this->pimpl->m_invDynGeneralizedProperAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynNetExtWrenches.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynInternalWrenches.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynLinkProperAccs.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynZeroVel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynZeroVel.baseVel().zero();
    this->pimpl->m_invDynZeroVel.jointVel().zero();
    this->pimpl->m_invDynZeroLinkVel.resize(this->pimpl->m_robot_model);
    this->pimpl->m_invDynZeroLinkProperAcc.resize(this->pimpl->m_robot_model);
    this->pimpl->m_traversalCache.resize(this->pimpl->m_robot_model);
    this->pimpl->m_generalizedForcesContainer.resize(this->pimpl->m_robot_model);

    for(LinkIndex lnkIdx = 0; lnkIdx < static_cast<LinkIndex>(pimpl->m_robot_model.getNrOfLinks()); lnkIdx++)
    {
        pimpl->m_invDynZeroLinkVel(lnkIdx).zero();
    }
}